

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::~GeneratedCodeInfo_Annotation
          (GeneratedCodeInfo_Annotation *this)

{
  RepeatedField<int> *in_RDI;
  GeneratedCodeInfo_Annotation *in_stack_00000050;
  
  *(undefined ***)in_RDI = &PTR__GeneratedCodeInfo_Annotation_009592f0;
  SharedDtor(in_stack_00000050);
  RepeatedField<int>::~RepeatedField(in_RDI);
  internal::InternalMetadataWithArena::~InternalMetadataWithArena
            ((InternalMetadataWithArena *)0x5295c0);
  Message::~Message((Message *)0x5295ca);
  return;
}

Assistant:

GeneratedCodeInfo_Annotation::~GeneratedCodeInfo_Annotation() {
  // @@protoc_insertion_point(destructor:google.protobuf.GeneratedCodeInfo.Annotation)
  SharedDtor();
}